

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex_tree_serialization_unit_test.cpp
# Opt level: O3

void basic_simplex_tree_serialization_invoker::run<Gudhi::Simplex_tree<Low_options>>
               (type<Gudhi::Simplex_tree<Low_options>_> *param_1)

{
  undefined8 uVar1;
  basic_simplex_tree_serialization<Gudhi::Simplex_tree<Low_options>_> t;
  basic_simplex_tree_serialization<Gudhi::Simplex_tree<Low_options>_> local_289;
  string local_288;
  undefined7 uStack_287;
  long local_278 [2];
  char *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  ostringstream local_218 [112];
  ios_base local_1a8 [264];
  undefined1 *local_a0;
  long local_98;
  undefined1 local_90;
  undefined7 uStack_8f;
  undefined1 *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_228 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_serialization_unit_test.cpp"
  ;
  local_220 = "";
  memset(local_218,0,0x198);
  std::__cxx11::ostringstream::ostringstream(local_218);
  local_98 = 0;
  local_90 = 0;
  local_288 = (string)0x22;
  local_a0 = &local_90;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,(char *)&local_288,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_218,"basic_simplex_tree_serialization",0x20);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"\" fixture ctor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_a0,&local_288);
  if ((long *)CONCAT71(uStack_287,local_288) != local_278) {
    operator_delete((long *)CONCAT71(uStack_287,local_288),local_278[0] + 1);
  }
  local_40 = local_a0;
  local_38 = local_a0 + local_98;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_228,0x68);
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_218);
  std::ios_base::~ios_base(local_1a8);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_238 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_serialization_unit_test.cpp"
  ;
  local_230 = "";
  memset(local_218,0,0x198);
  std::__cxx11::ostringstream::ostringstream(local_218);
  local_98 = 0;
  local_90 = 0;
  local_288 = (string)0x22;
  local_a0 = &local_90;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,(char *)&local_288,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_218,"basic_simplex_tree_serialization",0x20);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"\" fixture setup",0xf);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_a0,&local_288);
  if ((long *)CONCAT71(uStack_287,local_288) != local_278) {
    operator_delete((long *)CONCAT71(uStack_287,local_288),local_278[0] + 1);
  }
  local_50 = local_a0;
  local_48 = local_a0 + local_98;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_238,0x68);
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_218);
  std::ios_base::~ios_base(local_1a8);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_248 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_serialization_unit_test.cpp"
  ;
  local_240 = "";
  memset(local_218,0,0x198);
  std::__cxx11::ostringstream::ostringstream(local_218);
  local_98 = 0;
  local_90 = 0;
  local_288 = (string)0x22;
  local_a0 = &local_90;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,(char *)&local_288,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_218,"basic_simplex_tree_serialization",0x20);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"\" test entry",0xc);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_a0,&local_288);
  if ((long *)CONCAT71(uStack_287,local_288) != local_278) {
    operator_delete((long *)CONCAT71(uStack_287,local_288),local_278[0] + 1);
  }
  local_60 = local_a0;
  local_58 = local_a0 + local_98;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_248,0x68);
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_218);
  std::ios_base::~ios_base(local_1a8);
  basic_simplex_tree_serialization<Gudhi::Simplex_tree<Low_options>_>::test_method(&local_289);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_258 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_serialization_unit_test.cpp"
  ;
  local_250 = "";
  memset(local_218,0,0x198);
  std::__cxx11::ostringstream::ostringstream(local_218);
  local_98 = 0;
  local_90 = 0;
  local_288 = (string)0x22;
  local_a0 = &local_90;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,(char *)&local_288,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_218,"basic_simplex_tree_serialization",0x20);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_218,"\" fixture teardown",0x12);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_a0,&local_288);
  if ((long *)CONCAT71(uStack_287,local_288) != local_278) {
    operator_delete((long *)CONCAT71(uStack_287,local_288),local_278[0] + 1);
  }
  local_70 = local_a0;
  local_68 = local_a0 + local_98;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_258,0x68);
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_218);
  std::ios_base::~ios_base(local_1a8);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_268 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_serialization_unit_test.cpp"
  ;
  local_260 = "";
  memset(local_218,0,0x198);
  std::__cxx11::ostringstream::ostringstream(local_218);
  local_98 = 0;
  local_90 = 0;
  local_288 = (string)0x22;
  local_a0 = &local_90;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,(char *)&local_288,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_218,"basic_simplex_tree_serialization",0x20);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"\" fixture dtor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_a0,&local_288);
  if ((long *)CONCAT71(uStack_287,local_288) != local_278) {
    operator_delete((long *)CONCAT71(uStack_287,local_288),local_278[0] + 1);
  }
  local_80 = local_a0;
  local_78 = local_a0 + local_98;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_268,0x68);
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_218);
  std::ios_base::~ios_base(local_1a8);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE_TEMPLATE(basic_simplex_tree_serialization, Stree, list_of_tested_variants) {
  std::clog << "********************************************************************" << std::endl;
  std::clog << "BASIC SIMPLEX TREE SERIALIZATION/DESERIALIZATION" << std::endl;
  Stree st;

  using Filtration_type = typename Stree::Filtration_value;
  using Vertex_type = typename Stree::Vertex_handle;

  if (Stree::Options::store_filtration)
    st.insert_simplex({0},    random_filtration<Filtration_type>());
  else
    st.insert_simplex({0});
  if (Stree::Options::store_filtration)
    st.insert_simplex({1},    random_filtration<Filtration_type>());
  else
    st.insert_simplex({1});
  if (Stree::Options::store_filtration)
    st.insert_simplex({2},    random_filtration<Filtration_type>());
  else
    st.insert_simplex({2});
  if (Stree::Options::store_filtration)
    st.insert_simplex({0, 2}, random_filtration<Filtration_type>());
  else
    st.insert_simplex({0, 2});

  char* buffer = new char[256];
  char* ptr = buffer;
  // 3 simplices ({0}, {1}, {2}) and its filtration values
  ptr = serialize_value_to_char_buffer(static_cast<Vertex_type>(3)     , ptr);
  ptr = serialize_value_to_char_buffer(static_cast<Vertex_type>(0)     , ptr);
  if (Stree::Options::store_filtration)
    ptr = serialize_value_to_char_buffer(st.filtration(st.find({0}))   , ptr);
  ptr = serialize_value_to_char_buffer(static_cast<Vertex_type>(1)     , ptr);
  if (Stree::Options::store_filtration)
    ptr = serialize_value_to_char_buffer(st.filtration(st.find({1}))   , ptr);
  ptr = serialize_value_to_char_buffer(static_cast<Vertex_type>(2)     , ptr);
  if (Stree::Options::store_filtration)
    ptr = serialize_value_to_char_buffer(st.filtration(st.find({2}))   , ptr);
  // 1 simplex (2) from {0, 2} and its filtration values
  ptr = serialize_value_to_char_buffer(static_cast<Vertex_type>(1)     , ptr);
  ptr = serialize_value_to_char_buffer(static_cast<Vertex_type>(2)     , ptr);
  if (Stree::Options::store_filtration)
    ptr = serialize_value_to_char_buffer(st.filtration(st.find({0, 2})), ptr);
  ptr = serialize_value_to_char_buffer(static_cast<Vertex_type>(0)     , ptr);  // (0, 2) end of leaf
  ptr = serialize_value_to_char_buffer(static_cast<Vertex_type>(0)     , ptr);  // (1) end of leaf
  ptr = serialize_value_to_char_buffer(static_cast<Vertex_type>(0)     , ptr);  // (2) end of leaf

  const std::size_t buffer_size = (ptr - buffer);
  std::clog << "Serialization size in bytes = " << buffer_size << std::endl;
  // Sizes are expressed in bytes
  const std::size_t vertex_size = sizeof(Vertex_type);
  const std::size_t filtration_size =
      Stree::Options::store_filtration ? get_serialization_size_of(random_filtration<Filtration_type>()) : 0;
  const std::size_t serialization_size = vertex_size + st.num_simplices() * (2 * vertex_size + filtration_size);
  BOOST_CHECK_EQUAL(serialization_size, buffer_size);

  Vertex_type vertex = 0;
  Filtration_type filtration(0);
  // Reset position pointer at start
  const char* c_ptr = buffer;
  // 3 simplices ({0}, {1}, {2}) and its filtration values
  c_ptr = deserialize_value_from_char_buffer(vertex, c_ptr);
  BOOST_CHECK(vertex == 3);
  c_ptr = deserialize_value_from_char_buffer(vertex, c_ptr);
  BOOST_CHECK(vertex == 0);
  if (Stree::Options::store_filtration) {
    c_ptr = deserialize_value_from_char_buffer(filtration, c_ptr);
    test_equality(filtration, st.filtration(st.find({0})));
  }
  c_ptr = deserialize_value_from_char_buffer(vertex, c_ptr);
  BOOST_CHECK(vertex == 1);
  if (Stree::Options::store_filtration) {
    c_ptr = deserialize_value_from_char_buffer(filtration, c_ptr);
    test_equality(filtration, st.filtration(st.find({1})));
  }
  c_ptr = deserialize_value_from_char_buffer(vertex, c_ptr);
  BOOST_CHECK(vertex == 2);
  if (Stree::Options::store_filtration) {
    c_ptr = deserialize_value_from_char_buffer(filtration, c_ptr);
    test_equality(filtration, st.filtration(st.find({2})));
  }
  // 1 simplex (2) from {0, 2} and its filtration values
  c_ptr = deserialize_value_from_char_buffer(vertex, c_ptr);
  BOOST_CHECK(vertex == 1);
  c_ptr = deserialize_value_from_char_buffer(vertex, c_ptr);
  BOOST_CHECK(vertex == 2);
  if (Stree::Options::store_filtration) {
    c_ptr = deserialize_value_from_char_buffer(filtration, c_ptr);
    test_equality(filtration, st.filtration(st.find({0, 2})));
  }
  c_ptr = deserialize_value_from_char_buffer(vertex, c_ptr);  // (0, 2) end of leaf
  BOOST_CHECK(vertex == 0);
  c_ptr = deserialize_value_from_char_buffer(vertex, c_ptr);  // (1) end of leaf
  BOOST_CHECK(vertex == 0);
  c_ptr = deserialize_value_from_char_buffer(vertex, c_ptr);  // (2) end of leaf
  BOOST_CHECK(vertex == 0);

  std::size_t index = static_cast<std::size_t>(c_ptr - buffer);
  std::clog << "Deserialization size in bytes = " << serialization_size << " - index = " << index << std::endl;
  BOOST_CHECK(serialization_size == index);

  const std::size_t stree_buffer_size = st.get_serialization_size();
  std::clog << "Serialization (from the simplex tree) size in bytes = " << stree_buffer_size << std::endl;
  BOOST_CHECK(serialization_size == stree_buffer_size);
  char* stree_buffer = new char[stree_buffer_size];
  st.serialize(stree_buffer, stree_buffer_size);


  std::clog << "\nSerialization (from the simplex tree):\n";
  for (std::size_t idx = 0; idx < stree_buffer_size; idx++) {
    std::clog << std::setfill('0') 
              << std::setw(2) 
              << std::uppercase 
              << std::hex << (0xFF & stree_buffer[idx]) << " " << std::dec;
  }
  std::clog << "\nSerialization (manual):\n";
  for (std::size_t idx = 0; idx < stree_buffer_size; idx++) {
    std::clog << std::setfill('0') 
              << std::setw(2) 
              << std::uppercase 
              << std::hex << (0xFF & buffer[idx]) << " " << std::dec;
  }
  BOOST_CHECK(strncmp(stree_buffer, buffer, stree_buffer_size) == 0);

  Stree st_from_buffer;
  st_from_buffer.deserialize(stree_buffer, serialization_size);
  std::clog << std::endl << std::endl << "Iterator on simplices:\n";
  for (auto simplex : st_from_buffer.complex_simplex_range()) {
    std::clog << "   ";
    for (auto vertex : st_from_buffer.simplex_vertex_range(simplex)) {
      std::clog << vertex << " ";
    }
    std::clog << " - filtration = " << st_from_buffer.filtration(simplex) << std::endl;
  }
  BOOST_CHECK(st_from_buffer == st);

  delete[] buffer;
  delete[] stree_buffer;
}